

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader14.cpp
# Opt level: O3

void __thiscall COLLADASaxFWL::SourceArrayLoader14::begin__param(SourceArrayLoader14 *this)

{
  long *plVar1;
  undefined8 *in_RSI;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_28 = *in_RSI;
  uStack_20 = in_RSI[1];
  local_18 = *(undefined4 *)(in_RSI + 2);
  uStack_14 = *(undefined4 *)((long)in_RSI + 0x14);
  uStack_10 = *(undefined4 *)(in_RSI + 3);
  uStack_c = *(undefined4 *)((long)in_RSI + 0x1c);
  plVar1 = *(long **)&(this->super_IParserImpl14).super_IParserImpl.mCOLLADAVersion;
  (**(code **)(*plVar1 + 0xa8))(plVar1,&local_28);
  return;
}

Assistant:

bool SourceArrayLoader14::begin__param( const COLLADASaxFWL14::param__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__param(attributeData));
COLLADASaxFWL::param__AttributeData attrData;
attrData.name = attributeData.name;
attrData.sid = attributeData.sid;
attrData.semantic = attributeData.semantic;
attrData.type = attributeData.type;
return mLoader->begin__param(attrData);
}